

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  uint8_t *puVar1;
  uint local_34;
  int local_30;
  uint count;
  int j;
  int i;
  char **result;
  uint8_t **states_local;
  lys_module *module_local;
  
  if (module == (lys_module *)0x0) {
    module_local = (lys_module *)0x0;
  }
  else {
    local_34 = (uint)module->features_size;
    for (count = 0; (int)count < (int)(uint)module->inc_size; count = count + 1) {
      local_34 = (module->inc[(int)count].submodule)->features_size + local_34;
    }
    module_local = (lys_module *)malloc((ulong)(local_34 + 1) << 3);
    if (module_local == (lys_module *)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
      module_local = (lys_module *)0x0;
    }
    else {
      if (states != (uint8_t **)0x0) {
        puVar1 = (uint8_t *)malloc((ulong)(local_34 + 1));
        *states = puVar1;
        if (*states == (uint8_t *)0x0) {
          ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list"
                );
          free(module_local);
          return (char **)0x0;
        }
      }
      local_34 = 0;
      for (count = 0; (int)count < (int)(uint)module->features_size; count = count + 1) {
        *(char **)(module_local->padding2 + (ulong)local_34 * 8 + -0x42) =
             module->features[(int)count].name;
        if (states != (uint8_t **)0x0) {
          if ((module->features[(int)count].flags & 0x100) == 0) {
            (*states)[local_34] = '\0';
          }
          else {
            (*states)[local_34] = '\x01';
          }
        }
        local_34 = local_34 + 1;
      }
      for (local_30 = 0; local_30 < (int)(uint)module->inc_size; local_30 = local_30 + 1) {
        for (count = 0; (int)count < (int)(uint)(module->inc[local_30].submodule)->features_size;
            count = count + 1) {
          *(char **)(module_local->padding2 + (ulong)local_34 * 8 + -0x42) =
               (module->inc[local_30].submodule)->features[(int)count].name;
          if (states != (uint8_t **)0x0) {
            if (((module->inc[local_30].submodule)->features[(int)count].flags & 0x100) == 0) {
              (*states)[local_34] = '\0';
            }
            else {
              (*states)[local_34] = '\x01';
            }
          }
          local_34 = local_34 + 1;
        }
      }
      *(undefined8 *)(module_local->padding2 + (ulong)local_34 * 8 + -0x42) = 0;
    }
  }
  return (char **)module_local;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(module->ctx), NULL);

    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        LY_CHECK_ERR_RETURN(!(*states), LOGMEM(module->ctx); free(result), NULL);
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}